

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O3

TestCaseGroup * vkt::geometry::createLayeredRenderingTests(TestContext *testCtx)

{
  undefined4 uVar1;
  TestContext *testCtx_00;
  undefined8 uVar2;
  _Alloc_hider description;
  long *name;
  char *__s;
  TestNode *node;
  long lVar3;
  string s;
  allocator<char> local_b9;
  TestNode *local_b8;
  TestNode *local_b0;
  string local_a8;
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  TestContext *local_48;
  long local_40;
  undefined8 *local_38;
  
  local_b0 = (TestNode *)operator_new(0x70);
  local_48 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b0,testCtx,"layered","Layered rendering tests.");
  lVar3 = 0;
  do {
    local_b8 = (TestNode *)operator_new(0x70);
    __s = ::vk::getImageViewTypeName((&DAT_00b73620)[lVar3 * 5]);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,__s,(allocator<char> *)&local_a8);
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)local_88);
    de::toLower(&local_68,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_b8,local_48,local_68._M_dataplus._M_p,"");
    local_40 = lVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    local_38 = (undefined8 *)(&DAT_00b73620 + lVar3 * 5);
    lVar3 = 0x10;
    do {
      uVar1 = *(undefined4 *)((long)&PTR_typeinfo_00d4f8f0 + lVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,*(char **)(&UNK_00d4f8f8 + lVar3),(allocator<char> *)&local_68);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,*(char **)((long)&DAT_00d4f900 + lVar3),&local_b9);
      name = local_88[0];
      description._M_p = local_a8._M_dataplus._M_p;
      testCtx_00 = local_b8->m_testCtx;
      node = (TestNode *)operator_new(0x98);
      tcu::TestCase::TestCase
                ((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,(char *)name,description._M_p);
      node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d4f9b8;
      node[1]._vptr_TestNode = (_func_int **)anon_unknown_0::initPrograms;
      node[1].m_testCtx = (TestContext *)anon_unknown_0::test;
      *(undefined4 *)&node[1].m_name._M_dataplus._M_p = uVar1;
      uVar2 = local_38[1];
      *(undefined8 *)((long)&node[1].m_name._M_dataplus._M_p + 4) = *local_38;
      *(undefined8 *)((long)&node[1].m_name._M_string_length + 4) = uVar2;
      *(undefined4 *)((long)&node[1].m_name.field_2 + 4) = *(undefined4 *)(local_38 + 2);
      tcu::TestNode::addChild(local_b8,node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_88[0] != local_78) {
        operator_delete(local_88[0],local_78[0] + 1);
      }
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0xb8);
    tcu::TestNode::addChild(local_b0,local_b8);
    lVar3 = local_40 + 1;
  } while (lVar3 != 5);
  return (TestCaseGroup *)local_b0;
}

Assistant:

tcu::TestCaseGroup* createLayeredRenderingTests (tcu::TestContext& testCtx)
{
	MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "layered", "Layered rendering tests."));

	const struct
	{
		TestType		test;
		const char*		name;
		const char*		description;
	} testTypes[] =
	{
		{ TEST_TYPE_DEFAULT_LAYER,					"render_to_default_layer",			"Render to the default layer"															},
		{ TEST_TYPE_SINGLE_LAYER,					"render_to_one",					"Render to one layer"																	},
		{ TEST_TYPE_ALL_LAYERS,						"render_to_all",					"Render to all layers"																	},
		{ TEST_TYPE_DIFFERENT_CONTENT,				"render_different_content",			"Render different data to different layers"												},
		{ TEST_TYPE_LAYER_ID,						"fragment_layer",					"Read gl_Layer in fragment shader"														},
		{ TEST_TYPE_INVOCATION_PER_LAYER,			"invocation_per_layer",				"Render to multiple layers with multiple invocations, one invocation per layer"			},
		{ TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION,	"multiple_layers_per_invocation",	"Render to multiple layers with multiple invocations, multiple layers per invocation",	},
	};

	const ImageParams imageParams[] =
	{
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		{ 64,  1, 1 },	4	},
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		{ 64, 64, 1 },	4	},
		{ VK_IMAGE_VIEW_TYPE_CUBE,			{ 64, 64, 1 },	6	},
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	{ 64, 64, 1 },	2*6	},
		{ VK_IMAGE_VIEW_TYPE_3D,			{ 64, 64, 8 },	1	}
	};

	for (int imageParamNdx = 0; imageParamNdx < DE_LENGTH_OF_ARRAY(imageParams); ++imageParamNdx)
	{
		MovePtr<tcu::TestCaseGroup> viewTypeGroup(new tcu::TestCaseGroup(testCtx, getShortImageViewTypeName(imageParams[imageParamNdx].viewType).c_str(), ""));

		for (int testTypeNdx = 0; testTypeNdx < DE_LENGTH_OF_ARRAY(testTypes); ++testTypeNdx)
		{
			const TestParams params =
			{
				testTypes[testTypeNdx].test,
				imageParams[imageParamNdx],
			};
			addFunctionCaseWithPrograms(viewTypeGroup.get(), testTypes[testTypeNdx].name, testTypes[testTypeNdx].description, initPrograms, test, params);
		}

		group->addChild(viewTypeGroup.release());
	}

	return group.release();
}